

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClassifier.cpp
# Opt level: O0

LPCUTF8 Js::CharClassifier::SkipIdentifierSurrogateStartEnd
                  (LPCUTF8 psz,LPCUTF8 end,CharClassifier *instance)

{
  bool bVar1;
  char16 cVar2;
  DecodeOptions DVar3;
  codepoint_t local_38;
  DecodeOptions local_34;
  codepoint_t currentChar;
  DecodeOptions options;
  LPCUTF8 currentPosition;
  CharClassifier *instance_local;
  LPCUTF8 end_local;
  LPCUTF8 psz_local;
  
  local_34 = doAllowThreeByteSurrogates;
  _currentChar = psz;
  currentPosition = (LPCUTF8)instance;
  instance_local = (CharClassifier *)end;
  end_local = psz;
  cVar2 = utf8::Decode((LPCUTF8 *)&currentChar,end,&local_34,(bool *)0x0);
  local_38 = (codepoint_t)(ushort)cVar2;
  DVar3 = utf8::operator&(local_34,doSecondSurrogatePair);
  if (DVar3 != doDefault) {
    cVar2 = utf8::Decode((LPCUTF8 *)&currentChar,(LPCUTF8)instance_local,&local_34,(bool *)0x0);
    local_38 = NumberUtilities::SurrogatePairAsCodePoint(local_38,(uint)(ushort)cVar2);
  }
  bVar1 = IsIdStart((CharClassifier *)currentPosition,local_38);
  if (bVar1) {
    do {
      end_local = _currentChar;
      cVar2 = utf8::Decode((LPCUTF8 *)&currentChar,(LPCUTF8)instance_local,&local_34,(bool *)0x0);
      local_38 = (codepoint_t)(ushort)cVar2;
      if (local_38 == 0) {
        return end_local;
      }
      DVar3 = utf8::operator&(local_34,doSecondSurrogatePair);
      if (DVar3 != doDefault) {
        cVar2 = utf8::Decode((LPCUTF8 *)&currentChar,(LPCUTF8)instance_local,&local_34,(bool *)0x0);
        local_38 = NumberUtilities::SurrogatePairAsCodePoint(local_38,(uint)(ushort)cVar2);
      }
      bVar1 = IsIdContinue((CharClassifier *)currentPosition,local_38);
    } while (bVar1);
    psz_local = end_local;
  }
  else {
    psz_local = end_local;
  }
  return psz_local;
}

Assistant:

const LPCUTF8 Js::CharClassifier::SkipIdentifierSurrogateStartEnd(LPCUTF8 psz, LPCUTF8 end, const CharClassifier *instance)
{

    LPCUTF8 currentPosition = psz;
    utf8::DecodeOptions options = utf8::doAllowThreeByteSurrogates;

    // Similar reasoning to above, however we do have surrogate identifiers, but less likely to occur in code.
    codepoint_t currentChar = utf8::Decode(currentPosition, end, options);

    if (options & utf8::doSecondSurrogatePair)
    {
        currentChar = Js::NumberUtilities::SurrogatePairAsCodePoint(currentChar, utf8::Decode(currentPosition, end, options));
    }

    if (!instance->IsIdStart(currentChar))
    {
        return psz;
    }

    psz = currentPosition;

    // Slow path is to check for a surrogate each iteration.
    // There is no new surrogate whitespaces as of yet, however, might be in the future, so surrogates still need to be checked
    // So, based on that, best way is to hit the slow path if the current character is not a whitespace in [0, FFFF];
    while((currentChar = utf8::Decode(currentPosition, end, options)) != '\0')
    {
        if (options & utf8::doSecondSurrogatePair)
        {
            currentChar = Js::NumberUtilities::SurrogatePairAsCodePoint(currentChar, utf8::Decode(currentPosition, end, options));
        }

        if (!instance->IsIdContinue(currentChar))
        {
            return psz;
        }

        psz = currentPosition;
    }

    return psz;
}